

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_disk_directory_traversals.c
# Opt level: O0

void test_basic(char *compression_type)

{
  int iVar1;
  archive *a_00;
  archive_entry *paVar2;
  archive_entry *paVar3;
  archive *paVar4;
  long in_RDI;
  size_t unaff_retaddr;
  char *in_stack_00000008;
  void *in_stack_00000010;
  char *buff;
  size_t buffsize;
  size_t used;
  archive *a;
  archive_entry *ae;
  char filedata [64];
  void *in_stack_ffffffffffffff78;
  archive_entry *paVar5;
  void *pvVar6;
  archive_entry *entry;
  archive *paVar7;
  archive_entry **ppaVar8;
  archive_entry *in_stack_ffffffffffffff80;
  uint uVar12;
  archive_entry *paVar9;
  archive *paVar10;
  char *pcVar11;
  archive *in_stack_ffffffffffffff88;
  char *pcVar13;
  archive *a_01;
  wchar_t in_stack_ffffffffffffffa4;
  void *in_stack_ffffffffffffffb0;
  archive *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  wchar_t in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  void *in_stack_ffffffffffffffd8;
  wchar_t in_stack_ffffffffffffffe4;
  char *in_stack_ffffffffffffffe8;
  
  a_01 = (archive *)0x3e8;
  a_00 = (archive *)malloc(1000);
  paVar2 = (archive_entry *)archive_write_new();
  assertion_assert((char *)a_00,(wchar_t)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,
                   in_stack_ffffffffffffff78);
  archive_write_set_format_7zip(in_stack_ffffffffffffff88);
  paVar5 = paVar2;
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),
                      (longlong)in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,
                      (longlong)paVar2,(char *)0x1e37a3,in_stack_ffffffffffffffb0);
  if ((in_RDI != 0) &&
     (iVar1 = archive_write_set_format_option
                        (a_00,(char *)in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,
                         (char *)paVar2), iVar1 != 0)) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                   ,L'0');
    test_skipping("%s writing not fully supported on this platform",in_RDI);
    archive_write_free((archive *)0x1e380b);
    assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),
                        (longlong)in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,0,
                        (char *)0x1e3839,in_stack_ffffffffffffffb0);
    free(a_00);
    return;
  }
  archive_write_add_filter_none((archive *)paVar5);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),
                      (longlong)in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,
                      (longlong)paVar5,(char *)0x1e3881,in_stack_ffffffffffffffb0);
  archive_write_open_memory
            (a_01,a_00,(size_t)in_stack_ffffffffffffff88,(size_t *)in_stack_ffffffffffffff80);
  paVar2 = paVar5;
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),
                      (longlong)in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,
                      (longlong)paVar5,(char *)0x1e38c9,in_stack_ffffffffffffffb0);
  paVar3 = archive_entry_new();
  assertion_assert((char *)a_00,(wchar_t)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,paVar5);
  archive_entry_set_mtime(paVar3,1,10);
  archive_entry_mtime(paVar3);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),
                      (longlong)in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,0,
                      (char *)0x1e394b,paVar3);
  archive_entry_mtime_nsec(paVar3);
  paVar5 = (archive_entry *)0x0;
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),
                      (longlong)in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,0,
                      (char *)0x1e3986,paVar3);
  archive_entry_copy_pathname(in_stack_ffffffffffffff80,(char *)paVar5);
  uVar12 = (uint)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  archive_entry_pathname(paVar5);
  paVar9 = (archive_entry *)((ulong)uVar12 << 0x20);
  assertion_equal_string
            ((char *)paVar2,in_stack_ffffffffffffffa4,(char *)a_01,(char *)a_00,
             (char *)in_stack_ffffffffffffff88,(char *)paVar9,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffc8);
  archive_entry_set_mode(paVar3,0x81ed);
  archive_entry_mode(paVar3);
  paVar5 = (archive_entry *)0x0;
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),
                      (longlong)in_stack_ffffffffffffff88,(char *)paVar9,0,(char *)0x1e3a2a,paVar3);
  archive_write_header((archive *)paVar9,paVar5);
  pvVar6 = (void *)0x0;
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),
                      (longlong)in_stack_ffffffffffffff88,(char *)paVar9,0,(char *)0x1e3a67,paVar3);
  archive_entry_free((archive_entry *)0x1e3a71);
  paVar5 = archive_entry_new();
  assertion_assert((char *)a_00,(wchar_t)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffff88,(char *)paVar9,pvVar6);
  archive_entry_set_mtime(paVar5,1,10);
  archive_entry_mtime(paVar5);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),
                      (longlong)in_stack_ffffffffffffff88,(char *)paVar9,0,(char *)0x1e3af3,paVar5);
  archive_entry_mtime_nsec(paVar5);
  paVar3 = (archive_entry *)0x0;
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),
                      (longlong)in_stack_ffffffffffffff88,(char *)paVar9,0,(char *)0x1e3b2e,paVar5);
  archive_entry_copy_pathname(paVar9,(char *)paVar3);
  archive_entry_pathname(paVar3);
  paVar9 = (archive_entry *)((ulong)paVar9 & 0xffffffff00000000);
  assertion_equal_string
            ((char *)paVar2,in_stack_ffffffffffffffa4,(char *)a_01,(char *)a_00,
             (char *)in_stack_ffffffffffffff88,(char *)paVar9,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffc8);
  archive_entry_set_mode(paVar5,0x8124);
  archive_entry_mode(paVar5);
  paVar3 = (archive_entry *)0x0;
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),
                      (longlong)in_stack_ffffffffffffff88,(char *)paVar9,0,(char *)0x1e3bd2,paVar5);
  archive_write_header((archive *)paVar9,paVar3);
  pvVar6 = (void *)0x0;
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),
                      (longlong)in_stack_ffffffffffffff88,(char *)paVar9,0,(char *)0x1e3c0f,paVar5);
  archive_entry_free((archive_entry *)0x1e3c19);
  paVar5 = archive_entry_new();
  assertion_assert((char *)a_00,(wchar_t)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffff88,(char *)paVar9,pvVar6);
  archive_entry_set_mtime(paVar5,1,100);
  archive_entry_mtime(paVar5);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),
                      (longlong)in_stack_ffffffffffffff88,(char *)paVar9,0,(char *)0x1e3c9b,paVar5);
  archive_entry_mtime_nsec(paVar5);
  paVar3 = (archive_entry *)0x0;
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),
                      (longlong)in_stack_ffffffffffffff88,(char *)paVar9,0,(char *)0x1e3cd6,paVar5);
  archive_entry_copy_pathname(paVar9,(char *)paVar3);
  archive_entry_pathname(paVar3);
  paVar9 = (archive_entry *)((ulong)paVar9 & 0xffffffff00000000);
  assertion_equal_string
            ((char *)paVar2,in_stack_ffffffffffffffa4,(char *)a_01,(char *)a_00,
             (char *)in_stack_ffffffffffffff88,(char *)paVar9,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffc8);
  archive_entry_set_mode(paVar5,0x81ed);
  archive_entry_mode(paVar5);
  paVar3 = (archive_entry *)0x0;
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),
                      (longlong)in_stack_ffffffffffffff88,(char *)paVar9,0,(char *)0x1e3d7a,paVar5);
  archive_entry_set_size(paVar5,8);
  archive_write_header((archive *)paVar9,paVar3);
  pvVar6 = (void *)0x0;
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),
                      (longlong)in_stack_ffffffffffffff88,(char *)paVar9,0,(char *)0x1e3dc6,paVar5);
  archive_entry_free((archive_entry *)0x1e3dd0);
  archive_write_data((archive *)paVar9,pvVar6,0x1e3de6);
  pvVar6 = (void *)0x0;
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),
                      (longlong)in_stack_ffffffffffffff88,(char *)paVar9,0,(char *)0x1e3e17,paVar5);
  archive_write_data((archive *)paVar9,pvVar6,0x1e3e2d);
  pvVar6 = (void *)0x0;
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),
                      (longlong)in_stack_ffffffffffffff88,(char *)paVar9,0,(char *)0x1e3e5b,paVar5);
  paVar5 = archive_entry_new();
  assertion_assert((char *)a_00,(wchar_t)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffff88,(char *)paVar9,pvVar6);
  archive_entry_set_mtime(paVar5,1,10);
  archive_entry_mtime(paVar5);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),
                      (longlong)in_stack_ffffffffffffff88,(char *)paVar9,0,(char *)0x1e3edd,paVar5);
  archive_entry_mtime_nsec(paVar5);
  paVar3 = (archive_entry *)0x0;
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),
                      (longlong)in_stack_ffffffffffffff88,(char *)paVar9,0,(char *)0x1e3f18,paVar5);
  archive_entry_copy_pathname(paVar9,(char *)paVar3);
  archive_entry_pathname(paVar3);
  paVar9 = (archive_entry *)((ulong)paVar9 & 0xffffffff00000000);
  assertion_equal_string
            ((char *)paVar2,in_stack_ffffffffffffffa4,(char *)a_01,(char *)a_00,
             (char *)in_stack_ffffffffffffff88,(char *)paVar9,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffc8);
  archive_entry_set_mode(paVar5,0x81ed);
  archive_entry_mode(paVar5);
  paVar3 = (archive_entry *)0x0;
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),
                      (longlong)in_stack_ffffffffffffff88,(char *)paVar9,0,(char *)0x1e3fbc,paVar5);
  archive_entry_set_size(paVar5,4);
  archive_write_header((archive *)paVar9,paVar3);
  pvVar6 = (void *)0x0;
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),
                      (longlong)in_stack_ffffffffffffff88,(char *)paVar9,0,(char *)0x1e4008,paVar5);
  archive_entry_free((archive_entry *)0x1e4012);
  archive_write_data((archive *)paVar9,pvVar6,0x1e4028);
  pvVar6 = (void *)0x0;
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),
                      (longlong)in_stack_ffffffffffffff88,(char *)paVar9,0,(char *)0x1e4059,paVar5);
  paVar5 = archive_entry_new();
  assertion_assert((char *)a_00,(wchar_t)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffff88,(char *)paVar9,pvVar6);
  archive_entry_set_mtime(paVar5,1,10);
  archive_entry_mtime(paVar5);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),
                      (longlong)in_stack_ffffffffffffff88,(char *)paVar9,0,(char *)0x1e40db,paVar5);
  archive_entry_mtime_nsec(paVar5);
  paVar3 = (archive_entry *)0x0;
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),
                      (longlong)in_stack_ffffffffffffff88,(char *)paVar9,0,(char *)0x1e4116,paVar5);
  archive_entry_copy_pathname(paVar9,(char *)paVar3);
  archive_entry_copy_symlink(paVar9,(char *)paVar3);
  archive_entry_pathname(paVar3);
  paVar9 = (archive_entry *)((ulong)paVar9 & 0xffffffff00000000);
  assertion_equal_string
            ((char *)paVar2,in_stack_ffffffffffffffa4,(char *)a_01,(char *)a_00,
             (char *)in_stack_ffffffffffffff88,(char *)paVar9,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffc8);
  archive_entry_set_mode(paVar5,0xa1ed);
  archive_entry_mode(paVar5);
  paVar3 = (archive_entry *)0x0;
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),
                      (longlong)in_stack_ffffffffffffff88,(char *)paVar9,0,(char *)0x1e41cb,paVar5);
  archive_write_header((archive *)paVar9,paVar3);
  entry = (archive_entry *)0x0;
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),
                      (longlong)in_stack_ffffffffffffff88,(char *)paVar9,0,(char *)0x1e4208,paVar5);
  archive_entry_free((archive_entry *)0x1e4212);
  paVar3 = archive_entry_new();
  assertion_assert((char *)a_00,(wchar_t)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffff88,(char *)paVar9,entry);
  archive_entry_set_mtime(paVar3,0xb,100);
  archive_entry_copy_pathname(paVar9,(char *)entry);
  archive_entry_set_mode(paVar3,0x41ed);
  archive_entry_set_size(paVar3,0x200);
  archive_write_header((archive *)paVar9,entry);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),
                      (longlong)in_stack_ffffffffffffff88,(char *)paVar9,(longlong)paVar2,
                      (char *)0x1e42c6,paVar3);
  failure("size should be zero so that applications know not to write");
  archive_entry_size(paVar3);
  pvVar6 = (void *)0x0;
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),
                      (longlong)in_stack_ffffffffffffff88,(char *)paVar9,0,(char *)0x1e430c,paVar3);
  archive_entry_free((archive_entry *)0x1e4316);
  archive_write_data((archive *)paVar9,pvVar6,0x1e432c);
  paVar5 = paVar2;
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),
                      (longlong)in_stack_ffffffffffffff88,(char *)paVar9,(longlong)paVar2,
                      (char *)0x1e435b,paVar3);
  paVar3 = archive_entry_new();
  assertion_assert((char *)a_00,(wchar_t)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffff88,(char *)paVar9,paVar2);
  archive_entry_set_mtime(paVar3,0xb,200);
  archive_entry_copy_pathname(paVar9,(char *)paVar2);
  archive_entry_set_mode(paVar3,0x41ed);
  archive_entry_set_size(paVar3,0x200);
  archive_write_header((archive *)paVar9,paVar2);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),
                      (longlong)in_stack_ffffffffffffff88,(char *)paVar9,(longlong)paVar5,
                      (char *)0x1e440f,paVar3);
  failure("size should be zero so that applications know not to write");
  archive_entry_size(paVar3);
  pvVar6 = (void *)0x0;
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),
                      (longlong)in_stack_ffffffffffffff88,(char *)paVar9,0,(char *)0x1e4455,paVar3);
  archive_entry_free((archive_entry *)0x1e445f);
  archive_write_data((archive *)paVar9,pvVar6,0x1e4475);
  paVar2 = paVar5;
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),
                      (longlong)in_stack_ffffffffffffff88,(char *)paVar9,(longlong)paVar5,
                      (char *)0x1e44a4,paVar3);
  paVar3 = archive_entry_new();
  assertion_assert((char *)a_00,(wchar_t)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffff88,(char *)paVar9,paVar5);
  archive_entry_set_mtime(paVar3,0xb,300);
  archive_entry_copy_pathname(paVar9,(char *)paVar5);
  archive_entry_set_mode(paVar3,0x41ed);
  archive_entry_set_size(paVar3,0x200);
  archive_write_header((archive *)paVar9,paVar5);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),
                      (longlong)in_stack_ffffffffffffff88,(char *)paVar9,(longlong)paVar2,
                      (char *)0x1e4558,paVar3);
  failure("size should be zero so that applications know not to write");
  archive_entry_size(paVar3);
  pvVar6 = (void *)0x0;
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),
                      (longlong)in_stack_ffffffffffffff88,(char *)paVar9,0,(char *)0x1e459e,paVar3);
  archive_entry_free((archive_entry *)0x1e45a8);
  archive_write_data((archive *)paVar9,pvVar6,0x1e45be);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),
                      (longlong)in_stack_ffffffffffffff88,(char *)paVar9,(longlong)paVar2,
                      (char *)0x1e45ed,paVar3);
  archive_write_close((archive *)0x1e45f7);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),
                      (longlong)in_stack_ffffffffffffff88,(char *)paVar9,0,(char *)0x1e4625,paVar3);
  archive_write_free((archive *)0x1e462f);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),
                      (longlong)in_stack_ffffffffffffff88,(char *)paVar9,0,(char *)0x1e465d,paVar3);
  paVar7 = (archive *)0x8;
  paVar10 = (archive *)0x2ebd63;
  pcVar13 = (char *)0x0;
  assertion_equal_mem(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd8,
                      in_stack_ffffffffffffffd0,
                      (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      in_stack_ffffffffffffffc0,unaff_retaddr,in_stack_00000008,in_stack_00000010);
  paVar4 = archive_read_new();
  assertion_assert((char *)a_00,(wchar_t)((ulong)pcVar13 >> 0x20),(wchar_t)pcVar13,(char *)paVar10,
                   paVar7);
  archive_read_support_format_all(paVar7);
  paVar7 = paVar4;
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      (longlong)paVar4,(char *)0x1e4714,paVar3);
  archive_read_support_filter_all(paVar4);
  paVar4 = paVar7;
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      (longlong)paVar7,(char *)0x1e474d,paVar3);
  read_open_memory_seek(a_00,pcVar13,(size_t)paVar10,(size_t)paVar7);
  paVar7 = paVar4;
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      (longlong)paVar4,(char *)0x1e4795,paVar3);
  archive_read_next_header(paVar10,(archive_entry **)paVar4);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      (longlong)paVar7,(char *)0x1e47d3,paVar3);
  archive_entry_mtime(paVar3);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      0,(char *)0x1e480e,paVar3);
  archive_entry_mtime_nsec(paVar3);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      0,(char *)0x1e4849,paVar3);
  archive_entry_atime(paVar3);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      0,(char *)0x1e4881,paVar3);
  archive_entry_ctime(paVar3);
  paVar5 = (archive_entry *)0x0;
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      0,(char *)0x1e48b9,paVar3);
  archive_entry_pathname(paVar5);
  pcVar11 = (char *)((ulong)paVar10 & 0xffffffff00000000);
  assertion_equal_string
            ((char *)paVar7,in_stack_ffffffffffffffa4,(char *)a_01,(char *)a_00,pcVar13,pcVar11,
             in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8);
  archive_entry_mode(paVar3);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,pcVar11,0,
                      (char *)0x1e493d,paVar3);
  archive_entry_size(paVar3);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,pcVar11,0,
                      (char *)0x1e4978,paVar3);
  archive_read_data(in_stack_ffffffffffffffb8,paVar3,(size_t)paVar7);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,pcVar11,
                      (longlong)paVar7,(char *)0x1e49bc,paVar3);
  ppaVar8 = (archive_entry **)0x8;
  paVar4 = (archive *)0x2ebd63;
  pcVar13 = (char *)0x0;
  assertion_equal_mem(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd8,
                      in_stack_ffffffffffffffd0,
                      (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      in_stack_ffffffffffffffc0,unaff_retaddr,in_stack_00000008,in_stack_00000010);
  archive_read_next_header(paVar4,ppaVar8);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar4,
                      (longlong)paVar7,(char *)0x1e4a45,paVar3);
  archive_entry_mtime(paVar3);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar4,0
                      ,(char *)0x1e4a80,paVar3);
  archive_entry_mtime_nsec(paVar3);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar4,0
                      ,(char *)0x1e4ab8,paVar3);
  archive_entry_atime(paVar3);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar4,0
                      ,(char *)0x1e4af0,paVar3);
  archive_entry_ctime(paVar3);
  paVar5 = (archive_entry *)0x0;
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar4,0
                      ,(char *)0x1e4b28,paVar3);
  archive_entry_pathname(paVar5);
  pcVar11 = (char *)((ulong)paVar4 & 0xffffffff00000000);
  assertion_equal_string
            ((char *)paVar7,in_stack_ffffffffffffffa4,(char *)a_01,(char *)a_00,pcVar13,pcVar11,
             in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8);
  archive_entry_mode(paVar3);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,pcVar11,0,
                      (char *)0x1e4bac,paVar3);
  archive_entry_size(paVar3);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,pcVar11,0,
                      (char *)0x1e4be7,paVar3);
  archive_read_data(in_stack_ffffffffffffffb8,paVar3,(size_t)paVar7);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,pcVar11,
                      (longlong)paVar7,(char *)0x1e4c2b,paVar3);
  ppaVar8 = (archive_entry **)0x4;
  paVar4 = (archive *)0x2e4953;
  pcVar13 = (char *)0x0;
  assertion_equal_mem(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd8,
                      in_stack_ffffffffffffffd0,
                      (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      in_stack_ffffffffffffffc0,unaff_retaddr,in_stack_00000008,in_stack_00000010);
  archive_read_next_header(paVar4,ppaVar8);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar4,
                      (longlong)paVar7,(char *)0x1e4cb4,paVar3);
  archive_entry_mtime(paVar3);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar4,0
                      ,(char *)0x1e4cef,paVar3);
  archive_entry_mtime_nsec(paVar3);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar4,0
                      ,(char *)0x1e4d27,paVar3);
  archive_entry_atime(paVar3);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar4,0
                      ,(char *)0x1e4d5f,paVar3);
  archive_entry_ctime(paVar3);
  paVar5 = (archive_entry *)0x0;
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar4,0
                      ,(char *)0x1e4d97,paVar3);
  archive_entry_pathname(paVar5);
  paVar5 = (archive_entry *)0x0;
  pcVar11 = (char *)((ulong)paVar4 & 0xffffffff00000000);
  assertion_equal_string
            ((char *)paVar7,in_stack_ffffffffffffffa4,(char *)a_01,(char *)a_00,pcVar13,pcVar11,
             in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8);
  archive_entry_symlink(paVar5);
  paVar10 = (archive *)((ulong)pcVar11 & 0xffffffff00000000);
  assertion_equal_string
            ((char *)paVar7,in_stack_ffffffffffffffa4,(char *)a_01,(char *)a_00,pcVar13,
             (char *)paVar10,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8);
  archive_entry_mode(paVar3);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      0,(char *)0x1e4e62,paVar3);
  archive_entry_size(paVar3);
  ppaVar8 = (archive_entry **)0x0;
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      0,(char *)0x1e4e9a,paVar3);
  archive_read_next_header(paVar10,ppaVar8);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      (longlong)paVar7,(char *)0x1e4ed8,paVar3);
  archive_entry_mtime(paVar3);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      0,(char *)0x1e4f13,paVar3);
  archive_entry_mtime_nsec(paVar3);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      0,(char *)0x1e4f4b,paVar3);
  archive_entry_atime(paVar3);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      0,(char *)0x1e4f83,paVar3);
  archive_entry_ctime(paVar3);
  paVar5 = (archive_entry *)0x0;
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      0,(char *)0x1e4fbb,paVar3);
  archive_entry_pathname(paVar5);
  paVar10 = (archive *)((ulong)paVar10 & 0xffffffff00000000);
  assertion_equal_string
            ((char *)paVar7,in_stack_ffffffffffffffa4,(char *)a_01,(char *)a_00,pcVar13,
             (char *)paVar10,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8);
  archive_entry_mode(paVar3);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      0,(char *)0x1e503f,paVar3);
  archive_entry_size(paVar3);
  ppaVar8 = (archive_entry **)0x0;
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      0,(char *)0x1e5077,paVar3);
  archive_read_next_header(paVar10,ppaVar8);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      (longlong)paVar7,(char *)0x1e50b5,paVar3);
  archive_entry_mtime(paVar3);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      0,(char *)0x1e50f0,paVar3);
  archive_entry_mtime_nsec(paVar3);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      0,(char *)0x1e5128,paVar3);
  archive_entry_atime(paVar3);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      0,(char *)0x1e5160,paVar3);
  archive_entry_ctime(paVar3);
  paVar5 = (archive_entry *)0x0;
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      0,(char *)0x1e5198,paVar3);
  archive_entry_pathname(paVar5);
  paVar10 = (archive *)((ulong)paVar10 & 0xffffffff00000000);
  assertion_equal_string
            ((char *)paVar7,in_stack_ffffffffffffffa4,(char *)a_01,(char *)a_00,pcVar13,
             (char *)paVar10,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8);
  archive_entry_mode(paVar3);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      0,(char *)0x1e521c,paVar3);
  archive_entry_size(paVar3);
  ppaVar8 = (archive_entry **)0x0;
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      0,(char *)0x1e5254,paVar3);
  archive_read_next_header(paVar10,ppaVar8);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      (longlong)paVar7,(char *)0x1e5292,paVar3);
  archive_entry_mtime(paVar3);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      0,(char *)0x1e52cd,paVar3);
  archive_entry_mtime_nsec(paVar3);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      0,(char *)0x1e5308,paVar3);
  archive_entry_atime(paVar3);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      0,(char *)0x1e5340,paVar3);
  archive_entry_ctime(paVar3);
  paVar5 = (archive_entry *)0x0;
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      0,(char *)0x1e5378,paVar3);
  archive_entry_pathname(paVar5);
  paVar10 = (archive *)((ulong)paVar10 & 0xffffffff00000000);
  assertion_equal_string
            ((char *)paVar7,in_stack_ffffffffffffffa4,(char *)a_01,(char *)a_00,pcVar13,
             (char *)paVar10,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8);
  archive_entry_mode(paVar3);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      0,(char *)0x1e53fc,paVar3);
  archive_entry_size(paVar3);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      0,(char *)0x1e5434,paVar3);
  archive_read_data(in_stack_ffffffffffffffb8,paVar3,(size_t)paVar7);
  paVar4 = paVar7;
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      (longlong)paVar7,(char *)0x1e5477,paVar3);
  archive_read_next_header(paVar10,(archive_entry **)paVar7);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      (longlong)paVar4,(char *)0x1e54b5,paVar3);
  archive_entry_mtime(paVar3);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      0,(char *)0x1e54f0,paVar3);
  archive_entry_mtime_nsec(paVar3);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      0,(char *)0x1e552b,paVar3);
  archive_entry_atime(paVar3);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      0,(char *)0x1e5563,paVar3);
  archive_entry_ctime(paVar3);
  paVar5 = (archive_entry *)0x0;
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      0,(char *)0x1e559b,paVar3);
  archive_entry_pathname(paVar5);
  paVar10 = (archive *)((ulong)paVar10 & 0xffffffff00000000);
  assertion_equal_string
            ((char *)paVar4,in_stack_ffffffffffffffa4,(char *)a_01,(char *)a_00,pcVar13,
             (char *)paVar10,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8);
  archive_entry_mode(paVar3);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      0,(char *)0x1e561f,paVar3);
  archive_entry_size(paVar3);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      0,(char *)0x1e5657,paVar3);
  archive_read_data(in_stack_ffffffffffffffb8,paVar3,(size_t)paVar4);
  paVar7 = paVar4;
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      (longlong)paVar4,(char *)0x1e569a,paVar3);
  archive_read_next_header(paVar10,(archive_entry **)paVar4);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      (longlong)paVar7,(char *)0x1e56d8,paVar3);
  archive_entry_mtime(paVar3);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      0,(char *)0x1e5713,paVar3);
  archive_entry_mtime_nsec(paVar3);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      0,(char *)0x1e574e,paVar3);
  archive_entry_atime(paVar3);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      0,(char *)0x1e5786,paVar3);
  archive_entry_ctime(paVar3);
  paVar5 = (archive_entry *)0x0;
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      0,(char *)0x1e57be,paVar3);
  archive_entry_pathname(paVar5);
  paVar10 = (archive *)((ulong)paVar10 & 0xffffffff00000000);
  assertion_equal_string
            ((char *)paVar7,in_stack_ffffffffffffffa4,(char *)a_01,(char *)a_00,pcVar13,
             (char *)paVar10,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8);
  archive_entry_mode(paVar3);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      0,(char *)0x1e5842,paVar3);
  archive_entry_size(paVar3);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      0,(char *)0x1e587a,paVar3);
  archive_read_data(in_stack_ffffffffffffffb8,paVar3,(size_t)paVar7);
  paVar4 = paVar7;
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      (longlong)paVar7,(char *)0x1e58bd,paVar3);
  archive_read_next_header(paVar10,(archive_entry **)paVar7);
  paVar7 = paVar4;
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      (longlong)paVar4,(char *)0x1e58fc,paVar3);
  archive_filter_code(paVar10,(int)((ulong)paVar4 >> 0x20));
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      (longlong)paVar7,(char *)0x1e5937,paVar3);
  archive_format(paVar7);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      (longlong)paVar7,(char *)0x1e5971,paVar3);
  archive_read_close((archive *)0x1e597b);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      0,(char *)0x1e59a9,paVar3);
  archive_read_free((archive *)0x1e59b3);
  assertion_equal_int((char *)a_01,(wchar_t)((ulong)a_00 >> 0x20),(longlong)pcVar13,(char *)paVar10,
                      0,(char *)0x1e59e1,paVar3);
  free(a_00);
  return;
}

Assistant:

static void
test_basic(void)
{
	struct archive *a;
	struct archive_entry *ae;
	const void *p;
	char *initial_cwd, *cwd;
	size_t size;
	int64_t offset;
	int file_count;
#if defined(_WIN32) && !defined(__CYGWIN__)
	wchar_t *wcwd, *wp, *fullpath;
#endif

	assertMakeDir("dir1", 0755);
	assertMakeFile("dir1/file1", 0644, "0123456789");
	assertMakeFile("dir1/file2", 0644, "hello world");
	assertMakeDir("dir1/sub1", 0755);
	assertMakeFile("dir1/sub1/file1", 0644, "0123456789");
	assertMakeDir("dir1/sub2", 0755);
	assertMakeFile("dir1/sub2/file1", 0644, "0123456789");
	assertMakeFile("dir1/sub2/file2", 0644, "0123456789");
	assertMakeDir("dir1/sub2/sub1", 0755);
	assertMakeDir("dir1/sub2/sub2", 0755);
	assertMakeDir("dir1/sub2/sub3", 0755);
	assertMakeFile("dir1/sub2/sub3/file", 0644, "xyz");
	file_count = 12;

	assert((ae = archive_entry_new()) != NULL);
	assert((a = archive_read_disk_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_disk_open(a, "dir1"));

	while (file_count--) {
		assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header2(a, ae));
		if (strcmp(archive_entry_pathname(ae), "dir1") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFDIR);
			assertEqualInt(1, archive_read_disk_can_descend(a));
		} else if (strcmp(archive_entry_pathname(ae),
		    "dir1/file1") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
			assertEqualInt(archive_entry_size(ae), 10);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 10);
			assertEqualInt((int)offset, 0);
			assertEqualMem(p, "0123456789", 10);
			assertEqualInt(ARCHIVE_EOF,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 0);
			assertEqualInt((int)offset, 10);
			assertEqualInt(0, archive_read_disk_can_descend(a));
		} else if (strcmp(archive_entry_pathname(ae),
		    "dir1/file2") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
			assertEqualInt(archive_entry_size(ae), 11);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 11);
			assertEqualInt((int)offset, 0);
			assertEqualMem(p, "hello world", 11);
			assertEqualInt(ARCHIVE_EOF,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 0);
			assertEqualInt((int)offset, 11);
			assertEqualInt(0, archive_read_disk_can_descend(a));
		} else if (strcmp(archive_entry_pathname(ae),
		    "dir1/sub1") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFDIR);
			assertEqualInt(1, archive_read_disk_can_descend(a));
		} else if (strcmp(archive_entry_pathname(ae),
		    "dir1/sub1/file1") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
			assertEqualInt(archive_entry_size(ae), 10);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 10);
			assertEqualInt((int)offset, 0);
			assertEqualMem(p, "0123456789", 10);
			assertEqualInt(ARCHIVE_EOF,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 0);
			assertEqualInt((int)offset, 10);
			assertEqualInt(0, archive_read_disk_can_descend(a));
		} else if (strcmp(archive_entry_pathname(ae),
		    "dir1/sub2") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFDIR);
			assertEqualInt(1, archive_read_disk_can_descend(a));
		} else if (strcmp(archive_entry_pathname(ae),
		    "dir1/sub2/file1") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
			assertEqualInt(archive_entry_size(ae), 10);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 10);
			assertEqualInt((int)offset, 0);
			assertEqualMem(p, "0123456789", 10);
			assertEqualInt(ARCHIVE_EOF,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 0);
			assertEqualInt((int)offset, 10);
			assertEqualInt(0, archive_read_disk_can_descend(a));
		} else if (strcmp(archive_entry_pathname(ae),
		    "dir1/sub2/file2") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
			assertEqualInt(archive_entry_size(ae), 10);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 10);
			assertEqualInt((int)offset, 0);
			assertEqualMem(p, "0123456789", 10);
			assertEqualInt(ARCHIVE_EOF,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 0);
			assertEqualInt((int)offset, 10);
			assertEqualInt(0, archive_read_disk_can_descend(a));
		} else if (strcmp(archive_entry_pathname(ae),
		    "dir1/sub2/sub1") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFDIR);
			assertEqualInt(1, archive_read_disk_can_descend(a));
		} else if (strcmp(archive_entry_pathname(ae),
		    "dir1/sub2/sub2") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFDIR);
			assertEqualInt(1, archive_read_disk_can_descend(a));
		} else if (strcmp(archive_entry_pathname(ae),
		    "dir1/sub2/sub3") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFDIR);
			assertEqualInt(1, archive_read_disk_can_descend(a));
		} else if (strcmp(archive_entry_pathname(ae),
		    "dir1/sub2/sub3/file") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
			assertEqualInt(archive_entry_size(ae), 3);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 3);
			assertEqualInt((int)offset, 0);
			assertEqualMem(p, "xyz", 3);
			assertEqualInt(ARCHIVE_EOF,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 0);
			assertEqualInt((int)offset, 3);
			assertEqualInt(0, archive_read_disk_can_descend(a));
		}
		if (archive_entry_filetype(ae) == AE_IFDIR) {
			/* Descend into the current object */
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_disk_descend(a));
		}
	}
	/* There is no entry. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header2(a, ae));

	/* Close the disk object. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));

	/*
	 * Test that call archive_read_disk_open_w, wchar_t version.
	 */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_disk_open_w(a, L"dir1"));

	file_count = 12;
	while (file_count--) {
		assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header2(a, ae));
		if (wcscmp(archive_entry_pathname_w(ae), L"dir1") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFDIR);
			assertEqualInt(1, archive_read_disk_can_descend(a));
		} else if (wcscmp(archive_entry_pathname_w(ae),
		    L"dir1/file1") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
			assertEqualInt(archive_entry_size(ae), 10);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 10);
			assertEqualInt((int)offset, 0);
			assertEqualMem(p, "0123456789", 10);
			assertEqualInt(ARCHIVE_EOF,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 0);
			assertEqualInt((int)offset, 10);
			assertEqualInt(0, archive_read_disk_can_descend(a));
		} else if (wcscmp(archive_entry_pathname_w(ae),
		    L"dir1/file2") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
			assertEqualInt(archive_entry_size(ae), 11);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 11);
			assertEqualInt((int)offset, 0);
			assertEqualMem(p, "hello world", 11);
			assertEqualInt(ARCHIVE_EOF,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 0);
			assertEqualInt((int)offset, 11);
			assertEqualInt(0, archive_read_disk_can_descend(a));
		} else if (wcscmp(archive_entry_pathname_w(ae),
		    L"dir1/sub1") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFDIR);
			assertEqualInt(1, archive_read_disk_can_descend(a));
		} else if (wcscmp(archive_entry_pathname_w(ae),
		    L"dir1/sub1/file1") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
			assertEqualInt(archive_entry_size(ae), 10);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 10);
			assertEqualInt((int)offset, 0);
			assertEqualMem(p, "0123456789", 10);
			assertEqualInt(ARCHIVE_EOF,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 0);
			assertEqualInt((int)offset, 10);
			assertEqualInt(0, archive_read_disk_can_descend(a));
		} else if (wcscmp(archive_entry_pathname_w(ae),
		    L"dir1/sub2") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFDIR);
			assertEqualInt(1, archive_read_disk_can_descend(a));
		} else if (wcscmp(archive_entry_pathname_w(ae),
		    L"dir1/sub2/file1") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
			assertEqualInt(archive_entry_size(ae), 10);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 10);
			assertEqualInt((int)offset, 0);
			assertEqualMem(p, "0123456789", 10);
			assertEqualInt(ARCHIVE_EOF,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 0);
			assertEqualInt((int)offset, 10);
			assertEqualInt(0, archive_read_disk_can_descend(a));
		} else if (wcscmp(archive_entry_pathname_w(ae),
		    L"dir1/sub2/file2") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
			assertEqualInt(archive_entry_size(ae), 10);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 10);
			assertEqualInt((int)offset, 0);
			assertEqualMem(p, "0123456789", 10);
			assertEqualInt(ARCHIVE_EOF,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 0);
			assertEqualInt((int)offset, 10);
			assertEqualInt(0, archive_read_disk_can_descend(a));
		} else if (wcscmp(archive_entry_pathname_w(ae),
		    L"dir1/sub2/sub1") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFDIR);
			assertEqualInt(1, archive_read_disk_can_descend(a));
		} else if (wcscmp(archive_entry_pathname_w(ae),
		    L"dir1/sub2/sub2") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFDIR);
			assertEqualInt(1, archive_read_disk_can_descend(a));
		} else if (wcscmp(archive_entry_pathname_w(ae),
		    L"dir1/sub2/sub3") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFDIR);
			assertEqualInt(1, archive_read_disk_can_descend(a));
		} else if (wcscmp(archive_entry_pathname_w(ae),
		    L"dir1/sub2/sub3/file") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
			assertEqualInt(archive_entry_size(ae), 3);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 3);
			assertEqualInt((int)offset, 0);
			assertEqualMem(p, "xyz", 3);
			assertEqualInt(ARCHIVE_EOF,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 0);
			assertEqualInt((int)offset, 3);
			assertEqualInt(0, archive_read_disk_can_descend(a));
		}
		if (archive_entry_filetype(ae) == AE_IFDIR) {
			/* Descend into the current object */
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_disk_descend(a));
		}
	}
	/* There is no entry. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header2(a, ae));

	/* Close the disk object. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));

	/*
	 * Test that call archive_read_disk_open with a regular file.
	 */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_disk_open(a, "dir1/file1"));

	/* dir1/file1 */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header2(a, ae));
	assertEqualInt(0, archive_read_disk_can_descend(a));
	assertEqualString(archive_entry_pathname(ae), "dir1/file1");
	assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
	assertEqualInt(archive_entry_size(ae), 10);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_data_block(a, &p, &size, &offset));
	assertEqualInt((int)size, 10);
	assertEqualInt((int)offset, 0);
	assertEqualMem(p, "0123456789", 10);

	/* There is no entry. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header2(a, ae));

	/* Close the disk object. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));


#if defined(_WIN32) && !defined(__CYGWIN__)
	/*
	 * Test for wildcard '*' or '?'
	 */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_disk_open(a, "dir1/*1"));

	/* dir1/file1 */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header2(a, ae));
	assertEqualInt(0, archive_read_disk_can_descend(a));
	assertEqualString(archive_entry_pathname(ae), "dir1/file1");
	assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
	assertEqualInt(archive_entry_size(ae), 10);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_data_block(a, &p, &size, &offset));
	assertEqualInt((int)size, 10);
	assertEqualInt((int)offset, 0);
	assertEqualMem(p, "0123456789", 10);

	/* dir1/sub1 */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header2(a, ae));
	assertEqualInt(1, archive_read_disk_can_descend(a));
	assertEqualString(archive_entry_pathname(ae), "dir1/sub1");
	assertEqualInt(archive_entry_filetype(ae), AE_IFDIR);

	/* Descend into the current object */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_disk_descend(a));

	/* dir1/sub1/file1 */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header2(a, ae));
	assertEqualInt(0, archive_read_disk_can_descend(a));
	assertEqualString(archive_entry_pathname(ae), "dir1/sub1/file1");
	assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
	assertEqualInt(archive_entry_size(ae), 10);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_data_block(a, &p, &size, &offset));
	assertEqualInt((int)size, 10);
	assertEqualInt((int)offset, 0);
	assertEqualMem(p, "0123456789", 10);

	/* There is no entry. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header2(a, ae));

	/* Close the disk object. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));

	/*
	 * Test for a full-path beginning with "//?/"
	 */
	wcwd = _wgetcwd(NULL, 0);
	fullpath = malloc(sizeof(wchar_t) * (wcslen(wcwd) + 32));
	wcscpy(fullpath, L"//?/");
	wcscat(fullpath, wcwd);
	wcscat(fullpath, L"/dir1/file1");
	free(wcwd);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_disk_open_w(a, fullpath));
	while ((wcwd = wcschr(fullpath, L'\\')) != NULL)
		*wcwd = L'/';

	/* dir1/file1 */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header2(a, ae));
	assertEqualInt(0, archive_read_disk_can_descend(a));
	assertEqualWString(archive_entry_pathname_w(ae), fullpath);
	assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
	assertEqualInt(archive_entry_size(ae), 10);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_data_block(a, &p, &size, &offset));
	assertEqualInt((int)size, 10);
	assertEqualInt((int)offset, 0);
	assertEqualMem(p, "0123456789", 10);

	/* There is no entry. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header2(a, ae));

	/* Close the disk object. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	free(fullpath);

	/*
	 * Test for wild card '*' or '?' with "//?/" prefix.
	 */
	wcwd = _wgetcwd(NULL, 0);
	fullpath = malloc(sizeof(wchar_t) * (wcslen(wcwd) + 32));
	wcscpy(fullpath, L"//?/");
	wcscat(fullpath, wcwd);
	wcscat(fullpath, L"/dir1/*1");
	free(wcwd);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_disk_open_w(a, fullpath));
	while ((wcwd = wcschr(fullpath, L'\\')) != NULL)
		*wcwd = L'/';

	/* dir1/file1 */
	wp = wcsrchr(fullpath, L'/');
	wcscpy(wp+1, L"file1");
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header2(a, ae));
	assertEqualInt(0, archive_read_disk_can_descend(a));
	assertEqualWString(archive_entry_pathname_w(ae), fullpath);
	assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
	assertEqualInt(archive_entry_size(ae), 10);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_data_block(a, &p, &size, &offset));
	assertEqualInt((int)size, 10);
	assertEqualInt((int)offset, 0);
	assertEqualMem(p, "0123456789", 10);

	/* dir1/sub1 */
	wcscpy(wp+1, L"sub1");
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header2(a, ae));
	assertEqualInt(1, archive_read_disk_can_descend(a));
	assertEqualWString(archive_entry_pathname_w(ae), fullpath);
	assertEqualInt(archive_entry_filetype(ae), AE_IFDIR);

	/* Descend into the current object */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_disk_descend(a));

	/* dir1/sub1/file1 */
	wcscpy(wp+1, L"sub1/file1");
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header2(a, ae));
	assertEqualInt(0, archive_read_disk_can_descend(a));
	assertEqualWString(archive_entry_pathname_w(ae), fullpath);
	assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
	assertEqualInt(archive_entry_size(ae), 10);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_data_block(a, &p, &size, &offset));
	assertEqualInt((int)size, 10);
	assertEqualInt((int)offset, 0);
	assertEqualMem(p, "0123456789", 10);

	/* There is no entry. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header2(a, ae));

	/* Close the disk object. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	free(fullpath);

#endif

	/*
	 * We should be on the initial directory where we performed
	 * archive_read_disk_new() after we perfome archive_read_free()
	 *  even if we broke off the directory traversals.
	 */

	/* Save current working directory. */
#ifdef PATH_MAX
	initial_cwd = getcwd(NULL, PATH_MAX);/* Solaris getcwd needs the size. */
#else
	initial_cwd = getcwd(NULL, 0);
#endif

	assertEqualIntA(a, ARCHIVE_OK, archive_read_disk_open(a, "dir1"));

	/* Step in a deep directory. */
	file_count = 12;
	while (file_count--) {
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_next_header2(a, ae));
		if (strcmp(archive_entry_pathname(ae),
		    "dir1/sub1/file1") == 0)
			/*
			 * We are on an another directory at this time.
			 */
			break;
		if (archive_entry_filetype(ae) == AE_IFDIR) {
			/* Descend into the current object */
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_disk_descend(a));
		}
	}
	/* Destroy the disk object. */
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/* We should be on the initial working directory. */
	failure(
	    "Current working directory does not return to the initial"
	    "directory");
#ifdef PATH_MAX
	cwd = getcwd(NULL, PATH_MAX);/* Solaris getcwd needs the size. */
#else
	cwd = getcwd(NULL, 0);
#endif
	assertEqualString(initial_cwd, cwd);
	free(initial_cwd);
	free(cwd);

	archive_entry_free(ae);
}